

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O3

void __thiscall
RenX_LoggingPlugin::RenX_OnKill
          (RenX_LoggingPlugin *this,Server *server,string_view killer,TeamType *killerTeam,
          PlayerInfo *victim,string_view damageType)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  long *local_60;
  long local_58;
  long local_50 [2];
  code *local_40;
  Server *local_38;
  
  if ((*(uint *)&this->field_0xa0 >> 0x19 & 1) == 0) {
    local_40 = RenX::Server::sendAdmChan;
  }
  else {
    local_40 = RenX::Server::sendLogChan;
  }
  local_60 = local_50;
  pcVar1 = (this->killFmt2)._M_dataplus._M_p;
  local_38 = server;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (this->killFmt2)._M_string_length);
  if (local_58 != 0) {
    RenX::processTags((string *)&local_60,local_38,(PlayerInfo *)0x0,victim,(BuildingInfo *)0x0);
    uVar2 = *(undefined8 *)(RenX::tags + 0x208);
    uVar3 = *(undefined8 *)(RenX::tags + 0x210);
    auVar4 = RenX::translateName(killer._M_len,killer._M_str);
    RenX::replace_tag(&local_60,uVar3,uVar2,auVar4._0_8_,auVar4._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3a8);
    uVar3 = *(undefined8 *)(RenX::tags + 0x3b0);
    auVar4 = RenX::getTeamColor(*killerTeam);
    RenX::replace_tag(&local_60,uVar3,uVar2,auVar4._0_8_,auVar4._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3c8);
    uVar3 = *(undefined8 *)(RenX::tags + 0x3d0);
    auVar4 = RenX::getTeamName(*killerTeam);
    RenX::replace_tag(&local_60,uVar3,uVar2,auVar4._0_8_,auVar4._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 1000);
    uVar3 = *(undefined8 *)(RenX::tags + 0x3f0);
    auVar4 = RenX::getFullTeamName(*killerTeam);
    RenX::replace_tag(&local_60,uVar3,uVar2,auVar4._0_8_,auVar4._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0x14c8);
    uVar3 = *(undefined8 *)(RenX::tags + 0x14d0);
    auVar4 = RenX::translateName(damageType._M_len,damageType._M_str);
    RenX::replace_tag(&local_60,uVar3,uVar2,auVar4._0_8_,auVar4._8_8_);
    (*local_40)(local_38,local_58,local_60);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnKill(RenX::Server &server, std::string_view killer, const RenX::TeamType &killerTeam, const RenX::PlayerInfo &victim, std::string_view damageType)
{
	logFuncType func;
	if (RenX_LoggingPlugin::killPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->killFmt2;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, nullptr, &victim);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_NAME_TAG, RenX::translateName(killer));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(killerTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(killerTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(killerTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_WEAPON_TAG, RenX::translateName(damageType));
		(server.*func)(msg);
	}
}